

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvPendulum_dns.c
# Opt level: O2

int RefSol(sunrealtype tf,N_Vector yref,int nout)

{
  double dVar1;
  int iVar2;
  int iVar3;
  void *returnvalue;
  double *pdVar4;
  void *returnvalue_00;
  FILE *__stream;
  undefined4 uVar5;
  int retval;
  sunrealtype local_d0;
  void *local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  undefined4 uStack_a0;
  uint uStack_9c;
  FILE *local_90;
  void *local_88;
  double local_80;
  double local_78;
  int local_6c;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  sunrealtype t;
  
  local_d0 = tf;
  returnvalue = (void *)N_VNew_Serial(2,sunctx);
  iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
  if (iVar2 == 0) {
    pdVar4 = (double *)N_VGetArrayPointer(returnvalue);
    *pdVar4 = 0.0;
    pdVar4[1] = 0.0;
    returnvalue_00 = (void *)CVodeCreate(2,sunctx);
    local_c0 = returnvalue_00;
    iVar2 = check_retval(returnvalue_00,"CVodeCreate",0);
    if (iVar2 == 0) {
      retval = CVodeInit(0,returnvalue_00,fref,returnvalue);
      iVar2 = 1;
      iVar3 = check_retval(&retval,"CVodeInit",1);
      if (iVar3 == 0) {
        retval = CVodeSStolerances(0x86a12b9b,0x86a12b9b,returnvalue_00);
        iVar2 = 1;
        iVar3 = check_retval(&retval,"CVodeSStolerances",1);
        if (iVar3 == 0) {
          local_c8 = (void *)SUNDenseMatrix(2,2,sunctx);
          iVar3 = check_retval(local_c8,"SUNDenseMatrix",0);
          if (iVar3 == 0) {
            local_88 = (void *)SUNLinSol_Dense(returnvalue,local_c8,sunctx);
            iVar3 = check_retval(local_88,"SUNLinSol_Dense",0);
            if (iVar3 == 0) {
              retval = CVodeSetLinearSolver(returnvalue_00,local_88,local_c8);
              iVar2 = 1;
              iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
              if (iVar3 == 0) {
                retval = CVodeSetMaxNumSteps(returnvalue_00,100000);
                iVar2 = 1;
                iVar3 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
                if (iVar3 == 0) {
                  retval = CVodeSetStopTime(SUB84(local_d0,0),returnvalue_00);
                  iVar2 = 1;
                  iVar3 = check_retval(&retval,"CVodeSetStopTime",1);
                  if (iVar3 == 0) {
                    __stream = fopen("cvPendulum_dns_ref.txt","w");
                    local_a8 = *pdVar4;
                    local_68 = pdVar4[1];
                    uStack_60 = 0;
                    local_78 = cos(local_a8);
                    local_80 = sin(local_a8);
                    local_b8._0_8_ = (ulong)local_68 ^ 0x8000000000000000;
                    local_b8._8_4_ = (undefined4)uStack_60;
                    local_b8._12_4_ = uStack_60._4_4_ ^ 0x80000000;
                    dVar1 = sin(local_a8);
                    uVar5 = local_b8._12_4_;
                    local_b8._8_4_ = local_b8._8_4_;
                    local_b8._0_8_ = local_b8._0_8_ * dVar1;
                    local_b8._12_4_ = uVar5;
                    dVar1 = cos(local_a8);
                    local_90 = __stream;
                    fprintf(__stream,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",0,SUB84(local_78,0)
                            ,local_80,local_b8._0_4_,local_68 * dVar1);
                    local_6c = nout + -1;
                    iVar3 = 0;
                    iVar2 = nout;
                    if (nout < 1) {
                      iVar2 = iVar3;
                    }
                    dVar1 = local_d0 / (double)nout;
                    local_58 = dVar1;
                    while( true ) {
                      local_78 = (double)CONCAT44(local_78._4_4_,iVar3);
                      if (iVar2 == iVar3) break;
                      local_50 = dVar1;
                      retval = CVodeSetStopTime(local_c0);
                      iVar3 = check_retval(&retval,"CVodeSetStopTime",1);
                      if (iVar3 != 0) {
LAB_00102da5:
                        N_VDestroy_Serial(returnvalue);
                        SUNMatDestroy(local_c8);
                        SUNLinSolFree(local_88);
                        CVodeFree(&local_c0);
                        fclose(local_90);
                        return retval;
                      }
                      retval = CVode(SUB84(local_d0,0),local_c0,returnvalue,&t,1);
                      iVar3 = check_retval(&retval,"CVode",1);
                      if (iVar3 != 0) goto LAB_00102da5;
                      local_a8 = *pdVar4;
                      local_68 = pdVar4[1];
                      uStack_60 = 0;
                      local_80 = t;
                      local_40 = cos(local_a8);
                      local_48 = sin(local_a8);
                      local_b8._0_8_ = (ulong)local_68 ^ 0x8000000000000000;
                      local_b8._8_4_ = (undefined4)uStack_60;
                      local_b8._12_4_ = uStack_60._4_4_ ^ 0x80000000;
                      dVar1 = sin(local_a8);
                      uVar5 = local_b8._12_4_;
                      local_b8._8_4_ = local_b8._8_4_;
                      local_b8._0_8_ = local_b8._0_8_ * dVar1;
                      local_b8._12_4_ = uVar5;
                      dVar1 = cos(local_a8);
                      fprintf(local_90,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",SUB84(local_80,0)
                              ,SUB84(local_40,0),local_48,local_b8._0_4_,local_68 * dVar1);
                      dVar1 = local_d0;
                      if (local_78._0_4_ < local_6c) {
                        dVar1 = local_50 + local_58;
                      }
                      iVar3 = local_78._0_4_ + 1;
                    }
                    fclose(local_90);
                    local_d0 = *pdVar4;
                    local_b8._8_8_ = 0;
                    local_b8._0_8_ = pdVar4[1];
                    pdVar4 = (double *)N_VGetArrayPointer(yref);
                    dVar1 = cos(local_d0);
                    *pdVar4 = dVar1;
                    dVar1 = sin(local_d0);
                    pdVar4[1] = dVar1;
                    uStack_9c = local_b8._12_4_ ^ 0x80000000;
                    local_a8 = -local_b8._0_8_;
                    uStack_a0 = local_b8._8_4_;
                    dVar1 = sin(local_d0);
                    pdVar4[2] = dVar1 * local_a8;
                    dVar1 = cos(local_d0);
                    pdVar4[3] = dVar1 * (double)local_b8._0_8_;
                    N_VDestroy_Serial(returnvalue);
                    SUNMatDestroy(local_c8);
                    SUNLinSolFree(local_88);
                    CVodeFree(&local_c0);
                    iVar2 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar2 = 1;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int RefSol(sunrealtype tf, N_Vector yref, int nout)
{
  FILE* FID           = NULL; /* output file     */
  void* cvode_mem     = NULL; /* CVODE memory    */
  N_Vector yy         = NULL; /* solution vector */
  sunrealtype* yydata = NULL; /* vector data     */
  SUNMatrix A         = NULL; /* Jacobian matrix */
  SUNLinearSolver LS  = NULL; /* linear solver   */

  int retval;                            /* reusable return flag  */
  int out;                               /* output counter        */
  sunrealtype dtout;                     /* output frequency      */
  sunrealtype tout;                      /* output time           */
  sunrealtype t;                         /* return time           */
  sunrealtype th, thd;                   /* theta and theta dot   */
  sunrealtype tol = SUN_RCONST(1.0e-14); /* integration tolerance */

  /* Create the solution vector */
  yy = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (-1); }

  /* Set the initial condition */
  yydata = N_VGetArrayPointer(yy);

  yydata[0] = ZERO; /* theta  */
  yydata[1] = ZERO; /* theta' */

  /* Create CVODE memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODE */
  retval = CVodeInit(cvode_mem, fref, ZERO, yy);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, tol, tol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODE */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set CVODE optional inputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  retval = CVodeSetStopTime(cvode_mem, tf);
  if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }

  /* Open output file */
  FID = fopen("cvPendulum_dns_ref.txt", "w");

  /* Output initial condition */
  th  = yydata[0];
  thd = yydata[1];
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

  /* Integrate to tf and periodically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tf, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    th  = yydata[0];
    thd = yydata[1];
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Get solution components */
  th  = yydata[0];
  thd = yydata[1];

  /* Convert to Cartesian reference solution */
  yydata = N_VGetArrayPointer(yref);

  yydata[0] = COS(th);
  yydata[1] = SIN(th);
  yydata[2] = -thd * SIN(th);
  yydata[3] = thd * COS(th);

  /* Free memory */
  N_VDestroy_Serial(yy);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);

  return (0);
}